

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O1

size_t gf2Create_keep(size_t m)

{
  size_t sVar1;
  
  sVar1 = utilMax(2,0x40,0x60);
  return sVar1 + ((ulong)((m & 0x3f) == 0) + (m + 0x3f >> 6) * 2) * 8 + 0x90;
}

Assistant:

size_t gf2Create_keep(size_t m)
{
	const size_t n = W_OF_B(m);
	const size_t n1 = n + (m % B_PER_W == 0);
	return sizeof(qr_o) + O_OF_W(n1 + n) + 
		utilMax(2, 
			sizeof(gf2_trinom_st),
			sizeof(gf2_pentanom_st));
}